

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intrapred.c
# Opt level: O3

void aom_highbd_h_predictor_32x64_c
               (uint16_t *dst,ptrdiff_t stride,uint16_t *above,uint16_t *left,int bd)

{
  uint16_t *puVar1;
  long lVar2;
  long lVar3;
  undefined4 uVar4;
  undefined1 auVar5 [16];
  
  lVar2 = 0;
  do {
    auVar5 = pshuflw(ZEXT216(left[lVar2]),ZEXT216(left[lVar2]),0);
    uVar4 = auVar5._0_4_;
    lVar3 = 0;
    do {
      puVar1 = dst + lVar3;
      *(undefined4 *)puVar1 = uVar4;
      *(undefined4 *)(puVar1 + 2) = uVar4;
      *(undefined4 *)(puVar1 + 4) = uVar4;
      *(undefined4 *)(puVar1 + 6) = uVar4;
      lVar3 = lVar3 + 8;
    } while (lVar3 != 0x20);
    lVar2 = lVar2 + 1;
    dst = dst + stride;
  } while (lVar2 != 0x40);
  return;
}

Assistant:

static inline void highbd_h_predictor(uint16_t *dst, ptrdiff_t stride, int bw,
                                      int bh, const uint16_t *above,
                                      const uint16_t *left, int bd) {
  int r;
  (void)above;
  (void)bd;
  for (r = 0; r < bh; r++) {
    aom_memset16(dst, left[r], bw);
    dst += stride;
  }
}